

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O0

void T_UConverter_fromUnicode_UTF32_BE_OFFSET_LOGIC(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uint8_t uVar1;
  char cVar2;
  UChar *pUVar3;
  int32_t *piVar4;
  UConverter *pUVar5;
  UBool UVar6;
  uchar *puVar7;
  uint8_t local_54;
  byte local_53;
  undefined1 local_52;
  undefined1 local_51;
  uint local_50;
  uchar temp [4];
  uint indexToWrite;
  int32_t offsetNum;
  UChar32 ch2;
  UChar32 ch;
  uchar *targetLimit;
  UChar *sourceLimit;
  int32_t *myOffsets;
  uchar *myTarget;
  UChar *mySource;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  myTarget = (uchar *)args->source;
  pUVar3 = args->sourceLimit;
  piVar4 = (int32_t *)args->targetLimit;
  temp[0] = '\0';
  temp[1] = '\0';
  temp[2] = '\0';
  temp[3] = '\0';
  if (myTarget < pUVar3) {
    if (args->converter->fromUnicodeStatus == 1) {
      ucnv_fromUWriteBytes_63
                (args->converter,"",4,&args->target,args->targetLimit,&args->offsets,-1,err);
      args->converter->fromUnicodeStatus = 0;
    }
    myOffsets = (int32_t *)args->target;
    sourceLimit = (UChar *)args->offsets;
    local_54 = '\0';
    if (args->converter->fromUChar32 == 0) goto LAB_0037e093;
    offsetNum = args->converter->fromUChar32;
    args->converter->fromUChar32 = 0;
    do {
      if (pUVar3 <= myTarget) {
        args->converter->fromUChar32 = offsetNum;
        if (args->flush != '\0') {
          *err = U_ILLEGAL_CHAR_FOUND;
        }
        goto LAB_0037e271;
      }
      if ((*(ushort *)myTarget & 0xfffffc00) != 0xdc00) {
        args->converter->fromUChar32 = offsetNum;
        *err = U_ILLEGAL_CHAR_FOUND;
        goto LAB_0037e271;
      }
      offsetNum = (offsetNum + -0xd800) * 0x400 + (uint)*(ushort *)myTarget + 0x2400;
      myTarget = myTarget + 2;
      do {
        local_53 = (byte)((uint)offsetNum >> 0x10) & 0x1f;
        local_52 = (char)((uint)offsetNum >> 8);
        local_51 = (char)offsetNum;
        for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
          if (myOffsets < piVar4) {
            *(uint8_t *)myOffsets = (&local_54)[local_50];
            *(uchar (*) [4])sourceLimit = temp;
            sourceLimit = sourceLimit + 2;
            myOffsets = (int32_t *)((long)myOffsets + 1);
          }
          else {
            uVar1 = (&local_54)[local_50];
            pUVar5 = args->converter;
            cVar2 = args->converter->charErrorBufferLength;
            args->converter->charErrorBufferLength = cVar2 + '\x01';
            pUVar5->charErrorBuffer[cVar2] = uVar1;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
        }
        temp = (uchar  [4])((int)temp + 1 + (uint)((offsetNum & 0x1f0000U) != 0));
LAB_0037e093:
        if (pUVar3 <= myTarget || piVar4 <= myOffsets) goto LAB_0037e271;
        puVar7 = myTarget + 2;
        offsetNum = (int32_t)*(ushort *)myTarget;
        myTarget = puVar7;
      } while ((offsetNum & 0xfffff800U) != 0xd800);
    } while ((offsetNum & 0xfffffc00U) == 0xd800);
    args->converter->fromUChar32 = offsetNum;
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_0037e271:
    if (((myTarget < pUVar3) && (piVar4 <= myOffsets)) && (UVar6 = U_SUCCESS(*err), UVar6 != '\0'))
    {
      *err = U_BUFFER_OVERFLOW_ERROR;
    }
    args->target = (char *)myOffsets;
    args->source = (UChar *)myTarget;
    args->offsets = (int32_t *)sourceLimit;
  }
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_fromUnicode_UTF32_BE_OFFSET_LOGIC(UConverterFromUnicodeArgs * args,
                                               UErrorCode * err)
{
    const UChar *mySource = args->source;
    unsigned char *myTarget;
    int32_t *myOffsets;
    const UChar *sourceLimit = args->sourceLimit;
    const unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    UChar32 ch, ch2;
    int32_t offsetNum = 0;
    unsigned int indexToWrite;
    unsigned char temp[sizeof(uint32_t)];

    if(mySource >= sourceLimit) {
        /* no input, nothing to do */
        return;
    }

    /* write the BOM if necessary */
    if(args->converter->fromUnicodeStatus==UCNV_NEED_TO_WRITE_BOM) {
        static const char bom[]={ 0, 0, (char)0xfeu, (char)0xffu };
        ucnv_fromUWriteBytes(args->converter,
                             bom, 4,
                             &args->target, args->targetLimit,
                             &args->offsets, -1,
                             err);
        args->converter->fromUnicodeStatus=0;
    }

    myTarget = (unsigned char *) args->target;
    myOffsets = args->offsets;
    temp[0] = 0;

    if (args->converter->fromUChar32) {
        ch = args->converter->fromUChar32;
        args->converter->fromUChar32 = 0;
        goto lowsurogate;
    }

    while (mySource < sourceLimit && myTarget < targetLimit) {
        ch = *(mySource++);

        if (U_IS_SURROGATE(ch)) {
            if (U_IS_LEAD(ch)) {
lowsurogate:
                if (mySource < sourceLimit) {
                    ch2 = *mySource;
                    if (U_IS_TRAIL(ch2)) {
                        ch = ((ch - SURROGATE_HIGH_START) << HALF_SHIFT) + ch2 + SURROGATE_LOW_BASE;
                        mySource++;
                    }
                    else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        args->converter->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* ran out of source */
                    args->converter->fromUChar32 = ch;
                    if (args->flush) {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err = U_ILLEGAL_CHAR_FOUND;
                    }
                    break;
                }
            }
            else {
                /* this is an unmatched trail code unit (2nd surrogate) */
                /* callback(illegal) */
                args->converter->fromUChar32 = ch;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }

        /* We cannot get any larger than 10FFFF because we are coming from UTF-16 */
        temp[1] = (uint8_t) (ch >> 16 & 0x1F);
        temp[2] = (uint8_t) (ch >> 8);  /* unsigned cast implicitly does (ch & FF) */
        temp[3] = (uint8_t) (ch);       /* unsigned cast implicitly does (ch & FF) */

        for (indexToWrite = 0; indexToWrite <= sizeof(uint32_t) - 1; indexToWrite++) {
            if (myTarget < targetLimit) {
                *(myTarget++) = temp[indexToWrite];
                *(myOffsets++) = offsetNum;
            }
            else {
                args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = temp[indexToWrite];
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
        offsetNum = offsetNum + 1 + (temp[1] != 0);
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err)) {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
    args->offsets = myOffsets;
}